

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

App * __thiscall CLI::App::name(App *this,string *app_name)

{
  pointer pcVar1;
  App *pAVar2;
  App *base;
  string *psVar3;
  HorribleError *this_00;
  OptionAlreadyAdded *this_01;
  string oname;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (this->parent_ == (App *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&this->name_);
  }
  else {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_88[0] = local_78;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + (this->name_)._M_string_length);
    ::std::__cxx11::string::_M_assign((string *)&this->name_);
    pAVar2 = this->parent_;
    if (this->parent_ == (App *)0x0) {
      this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_7_ = 0x696c6156206f4e;
      local_48.field_2._M_local_buf[7] = 'd';
      local_48.field_2._8_7_ = 0x746e6572617020;
      local_48._M_string_length = 0xf;
      local_48.field_2._M_local_buf[0xf] = '\0';
      HorribleError::HorribleError(this_00,&local_48);
      __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
    }
    do {
      base = pAVar2;
      if (base->parent_ == (App *)0x0) break;
      pAVar2 = base->parent_;
    } while ((base->name_)._M_string_length == 0);
    psVar3 = _compare_subcommand_names_abi_cxx11_(this,this,base);
    if (psVar3->_M_string_length != 0) {
      ::std::__cxx11::string::_M_assign((string *)&this->name_);
      this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_68,app_name," conflicts with existing subcommand names");
      OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_68);
      __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,Error::~Error);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
  }
  this->has_automatic_name_ = false;
  return this;
}

Assistant:

CLI11_INLINE App *App::name(std::string app_name) {

    if(parent_ != nullptr) {
        std::string oname = name_;
        name_ = app_name;
        const auto &res = _compare_subcommand_names(*this, *_get_fallthrough_parent());
        if(!res.empty()) {
            name_ = oname;
            throw(OptionAlreadyAdded(app_name + " conflicts with existing subcommand names"));
        }
    } else {
        name_ = app_name;
    }
    has_automatic_name_ = false;
    return this;
}